

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O0

int Wildcard::set(char **wildcard,char **test)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int at_beginning;
  int negation;
  int fit;
  char **test_local;
  char **wildcard_local;
  
  fit = 0;
  bVar3 = true;
  cVar1 = **wildcard;
  if (cVar1 == '!') {
    *wildcard = *wildcard + 1;
  }
  while( true ) {
    bVar2 = true;
    if (**wildcard == ']') {
      bVar2 = bVar3;
    }
    if (!bVar2) break;
    if (fit == 0) {
      if ((((**wildcard != '-') || ((*wildcard)[1] <= (*wildcard)[-1])) || ((*wildcard)[1] == ']'))
         || (bVar3)) {
        if (**wildcard == **test) {
          fit = 1;
        }
      }
      else if (((*wildcard)[-1] <= **test) && (**test <= (*wildcard)[1])) {
        fit = 1;
        *wildcard = *wildcard + 1;
      }
    }
    *wildcard = *wildcard + 1;
    bVar3 = false;
  }
  if (cVar1 == '!') {
    fit = 1 - fit;
  }
  if (fit == 1) {
    *test = *test + 1;
  }
  return fit;
}

Assistant:

int Wildcard::set(const char** wildcard, const char** test) {
  int fit          = 0;
  int negation     = 0;
  int at_beginning = 1;

  if ('!' == **wildcard) {
    negation = 1;
    (*wildcard)++;
  }
  while ((']' != **wildcard) || (1 == at_beginning)) {
    if (0 == fit) {
      if (('-' == **wildcard) && ((*(*wildcard - 1)) < (*(*wildcard + 1))) &&
          (']' != *(*wildcard + 1)) && (0 == at_beginning)) {
        if (((**test) >= (*(*wildcard - 1))) &&
            ((**test) <= (*(*wildcard + 1)))) {
          fit = 1;
          (*wildcard)++;
        }
      } else if ((**wildcard) == (**test)) {
        fit = 1;
      }
    }
    (*wildcard)++;
    at_beginning = 0;
  }
  if (1 == negation) /* change from zero to one and vice versa */
    fit = 1 - fit;
  if (1 == fit) (*test)++;

  return (fit);
}